

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_test.cc
# Opt level: O0

void xLearn::check_double(DMatrix *matrix,bool has_label,bool has_field)

{
  bool bVar1;
  char *pcVar2;
  const_reference ppvVar3;
  size_type sVar4;
  byte in_DL;
  byte in_SIL;
  long in_RDI;
  float in_stack_00000108;
  float in_stack_0000010c;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  iterator iter;
  int n;
  SparseRow *row;
  AssertionResult gtest_ar_4;
  int col_len;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  index_t i;
  AssertionResult gtest_ar;
  vector<xLearn::Node,_std::allocator<xLearn::Node>_> *in_stack_fffffffffffffd48;
  __normal_iterator<xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
  *in_stack_fffffffffffffd50;
  AssertionResult *in_stack_fffffffffffffd58;
  undefined7 in_stack_fffffffffffffd60;
  undefined1 in_stack_fffffffffffffd67;
  char *in_stack_fffffffffffffd68;
  AssertHelper local_1c0;
  Message local_1b8;
  undefined4 local_1ac;
  AssertionResult local_1a8;
  AssertHelper local_198;
  Message local_190;
  AssertionResult local_188;
  AssertHelper local_178;
  Message local_170;
  AssertionResult local_168;
  AssertHelper local_158;
  Message local_150;
  undefined4 local_144;
  AssertionResult local_140;
  AssertHelper local_130;
  Message local_128;
  AssertionResult local_120;
  Node *local_110;
  __normal_iterator<xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
  local_108;
  int local_fc;
  value_type local_f8;
  AssertHelper local_f0;
  Message local_e8;
  undefined4 local_dc;
  AssertionResult local_d8;
  undefined4 local_c4;
  AssertHelper local_c0;
  Message local_b8;
  AssertionResult local_b0;
  AssertHelper local_a0;
  Message local_98;
  undefined4 local_8c;
  AssertionResult local_88;
  AssertHelper local_78;
  Message local_70;
  undefined4 local_64;
  AssertionResult local_60;
  uint local_4c;
  AssertHelper local_48;
  Message local_40 [3];
  undefined4 local_24;
  AssertionResult local_20;
  byte local_a;
  byte local_9;
  long local_8;
  
  local_9 = in_SIL & 1;
  local_a = in_DL & 1;
  local_24 = 200000;
  local_8 = in_RDI;
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            (in_stack_fffffffffffffd68,
             (char *)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60),
             (uint *)in_stack_fffffffffffffd58,(uint *)in_stack_fffffffffffffd50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_20);
  if (!bVar1) {
    testing::Message::Message(local_40);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x148556);
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/reader/parser_test.cc"
               ,0x55,pcVar2);
    testing::internal::AssertHelper::operator=(&local_48,local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    testing::Message::~Message((Message *)0x1485b9);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x148611);
  for (local_4c = 0; local_4c < *(uint *)(local_8 + 0x10); local_4c = local_4c + 1) {
    if ((local_9 & 1) == 0) {
      std::vector<float,_std::allocator<float>_>::operator[]
                ((vector<float,_std::allocator<float>_> *)(local_8 + 0x30),(ulong)local_4c);
      local_8c = 0xfffffffe;
      testing::internal::EqHelper<false>::Compare<float,int>
                (in_stack_fffffffffffffd68,
                 (char *)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60),
                 (float *)in_stack_fffffffffffffd58,(int *)in_stack_fffffffffffffd50);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_88);
      if (!bVar1) {
        testing::Message::Message(&local_98);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x148883);
        testing::internal::AssertHelper::AssertHelper
                  (&local_a0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/reader/parser_test.cc"
                   ,0x5b,pcVar2);
        testing::internal::AssertHelper::operator=(&local_a0,&local_98);
        testing::internal::AssertHelper::~AssertHelper(&local_a0);
        testing::Message::~Message((Message *)0x1488e6);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x14893b);
    }
    else {
      std::vector<float,_std::allocator<float>_>::operator[]
                ((vector<float,_std::allocator<float>_> *)(local_8 + 0x30),(ulong)local_4c);
      local_64 = 1;
      testing::internal::EqHelper<false>::Compare<float,int>
                (in_stack_fffffffffffffd68,
                 (char *)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60),
                 (float *)in_stack_fffffffffffffd58,(int *)in_stack_fffffffffffffd50);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_60);
      if (!bVar1) {
        testing::Message::Message(&local_70);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x148704);
        testing::internal::AssertHelper::AssertHelper
                  (&local_78,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/reader/parser_test.cc"
                   ,0x59,pcVar2);
        testing::internal::AssertHelper::operator=(&local_78,&local_70);
        testing::internal::AssertHelper::~AssertHelper(&local_78);
        testing::Message::~Message((Message *)0x148767);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x1487bc);
    }
    std::vector<float,_std::allocator<float>_>::operator[]
              ((vector<float,_std::allocator<float>_> *)(local_8 + 0x48),(ulong)local_4c);
    testing::internal::CmpHelperFloatingPointEQ<float>
              ((char *)gtest_ar_9.message_.ptr_,(char *)gtest_ar_9._0_8_,in_stack_0000010c,
               in_stack_00000108);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_b0);
    if (!bVar1) {
      testing::Message::Message(&local_b8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x1489f5);
      testing::internal::AssertHelper::AssertHelper
                (&local_c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/reader/parser_test.cc"
                 ,0x5d,pcVar2);
      testing::internal::AssertHelper::operator=(&local_c0,&local_b8);
      testing::internal::AssertHelper::~AssertHelper(&local_c0);
      testing::Message::~Message((Message *)0x148a58);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x148ab0);
    ppvVar3 = std::
              vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
              ::operator[]((vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
                            *)(local_8 + 0x18),(ulong)local_4c);
    sVar4 = std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::size(*ppvVar3);
    local_c4 = (undefined4)sVar4;
    local_dc = 5;
    testing::internal::EqHelper<false>::Compare<int,int>
              (in_stack_fffffffffffffd68,
               (char *)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60),
               (int *)in_stack_fffffffffffffd58,(int *)in_stack_fffffffffffffd50);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_d8);
    if (!bVar1) {
      testing::Message::Message(&local_e8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x148b86);
      testing::internal::AssertHelper::AssertHelper
                (&local_f0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/reader/parser_test.cc"
                 ,0x5f,pcVar2);
      testing::internal::AssertHelper::operator=(&local_f0,&local_e8);
      testing::internal::AssertHelper::~AssertHelper(&local_f0);
      testing::Message::~Message((Message *)0x148be9);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x148c41);
    ppvVar3 = std::
              vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
              ::operator[]((vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
                            *)(local_8 + 0x18),(ulong)local_4c);
    local_f8 = *ppvVar3;
    local_fc = 0;
    local_108._M_current =
         (Node *)std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::begin
                           (in_stack_fffffffffffffd48);
    while( true ) {
      local_110 = (Node *)std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::end
                                    (in_stack_fffffffffffffd48);
      bVar1 = __gnu_cxx::operator!=
                        (in_stack_fffffffffffffd50,
                         (__normal_iterator<xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                          *)in_stack_fffffffffffffd48);
      if (!bVar1) break;
      if ((local_a & 1) == 0) {
        __gnu_cxx::
        __normal_iterator<xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
        ::operator->(&local_108);
        local_144 = 0;
        testing::internal::EqHelper<false>::Compare<unsigned_int,int>
                  (in_stack_fffffffffffffd68,
                   (char *)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60),
                   (uint *)in_stack_fffffffffffffd58,(int *)in_stack_fffffffffffffd50);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_140);
        if (!bVar1) {
          testing::Message::Message(&local_150);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x148ec5);
          testing::internal::AssertHelper::AssertHelper
                    (&local_158,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/reader/parser_test.cc"
                     ,0x67,pcVar2);
          testing::internal::AssertHelper::operator=(&local_158,&local_150);
          testing::internal::AssertHelper::~AssertHelper(&local_158);
          testing::Message::~Message((Message *)0x148f22);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x148f77);
      }
      else {
        __gnu_cxx::
        __normal_iterator<xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
        ::operator->(&local_108);
        testing::internal::EqHelper<false>::Compare<unsigned_int,int>
                  (in_stack_fffffffffffffd68,
                   (char *)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60),
                   (uint *)in_stack_fffffffffffffd58,(int *)in_stack_fffffffffffffd50);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_120);
        if (!bVar1) {
          testing::Message::Message(&local_128);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x148d65);
          testing::internal::AssertHelper::AssertHelper
                    (&local_130,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/reader/parser_test.cc"
                     ,0x65,pcVar2);
          testing::internal::AssertHelper::operator=(&local_130,&local_128);
          testing::internal::AssertHelper::~AssertHelper(&local_130);
          testing::Message::~Message((Message *)0x148dc2);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x148e17);
      }
      __gnu_cxx::
      __normal_iterator<xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>::
      operator->(&local_108);
      testing::internal::EqHelper<false>::Compare<unsigned_int,int>
                (in_stack_fffffffffffffd68,
                 (char *)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60),
                 (uint *)in_stack_fffffffffffffd58,(int *)in_stack_fffffffffffffd50);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_168);
      if (!bVar1) {
        testing::Message::Message(&local_170);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x14901b);
        testing::internal::AssertHelper::AssertHelper
                  (&local_178,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/reader/parser_test.cc"
                   ,0x69,pcVar2);
        testing::internal::AssertHelper::operator=(&local_178,&local_170);
        testing::internal::AssertHelper::~AssertHelper(&local_178);
        testing::Message::~Message((Message *)0x149078);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x1490cd);
      __gnu_cxx::
      __normal_iterator<xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>::
      operator->(&local_108);
      testing::internal::CmpHelperFloatingPointEQ<float>
                ((char *)gtest_ar_9.message_.ptr_,(char *)gtest_ar_9._0_8_,in_stack_0000010c,
                 in_stack_00000108);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_188);
      if (!bVar1) {
        testing::Message::Message(&local_190);
        in_stack_fffffffffffffd68 =
             testing::AssertionResult::failure_message((AssertionResult *)0x14916d);
        testing::internal::AssertHelper::AssertHelper
                  (&local_198,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/reader/parser_test.cc"
                   ,0x6a,in_stack_fffffffffffffd68);
        testing::internal::AssertHelper::operator=(&local_198,&local_190);
        testing::internal::AssertHelper::~AssertHelper(&local_198);
        testing::Message::~Message((Message *)0x1491ca);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x14921f);
      local_fc = local_fc + 1;
      __gnu_cxx::
      __normal_iterator<xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>::
      operator++(&local_108);
    }
    local_1ac = 5;
    in_stack_fffffffffffffd58 = &local_1a8;
    testing::internal::EqHelper<false>::Compare<int,int>
              (in_stack_fffffffffffffd68,
               (char *)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60),
               (int *)in_stack_fffffffffffffd58,(int *)in_stack_fffffffffffffd50);
    in_stack_fffffffffffffd67 =
         testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffffd58);
    if (!(bool)in_stack_fffffffffffffd67) {
      testing::Message::Message(&local_1b8);
      in_stack_fffffffffffffd50 =
           (__normal_iterator<xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
            *)testing::AssertionResult::failure_message((AssertionResult *)0x1492e3);
      testing::internal::AssertHelper::AssertHelper
                (&local_1c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/reader/parser_test.cc"
                 ,0x6d,(char *)in_stack_fffffffffffffd50);
      testing::internal::AssertHelper::operator=(&local_1c0,&local_1b8);
      testing::internal::AssertHelper::~AssertHelper(&local_1c0);
      testing::Message::~Message((Message *)0x149340);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x149395);
  }
  return;
}

Assistant:

void check_double(const DMatrix& matrix, bool has_label, bool has_field) {
  EXPECT_EQ(matrix.row_length, 2*kNum_lines);
  // First check
  for (index_t i = 0; i < matrix.row_length; ++i) {
    if (has_label) {
      EXPECT_EQ(matrix.Y[i], 1);
    } else {
      EXPECT_EQ(matrix.Y[i], -2);
    }
    EXPECT_FLOAT_EQ(matrix.norm[i], 13.888889);
    int col_len = matrix.row[i]->size();
    EXPECT_EQ(col_len, 5);
    SparseRow *row = matrix.row[i];
    int n = 0;
    for (SparseRow::iterator iter = row->begin();
         iter != row->end(); ++iter) {
      if (has_field) {
        EXPECT_EQ(iter->field_id, n);
      } else {
        EXPECT_EQ(iter->field_id, 0);
      }
      EXPECT_EQ(iter->feat_id, n);
      EXPECT_FLOAT_EQ(iter->feat_val, 0.12);
      n++;
    }
    EXPECT_EQ(n, 5);
  }
}